

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodePCRelLabel19(MCInst *Inst,uint Imm,uint64_t Addr,void *Decoder)

{
  undefined8 local_30;
  int64_t ImmVal;
  void *Decoder_local;
  uint64_t Addr_local;
  uint Imm_local;
  MCInst *Inst_local;
  
  local_30 = (ulong)Imm;
  if ((Imm & 0x40000) != 0) {
    local_30 = local_30 | 0xfffffffffff80000;
  }
  MCOperand_CreateImm0(Inst,local_30);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodePCRelLabel19(MCInst *Inst, unsigned Imm,
		uint64_t Addr, void *Decoder)
{
	int64_t ImmVal = Imm;

	// Sign-extend 19-bit immediate.
	if (ImmVal & (1 << (19 - 1)))
		ImmVal |= ~((1LL << 19) - 1);

	MCOperand_CreateImm0(Inst, ImmVal);
	return Success;
}